

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void notch::core::connect<notch::core::FullyConnectedLayer,notch::core::EuclideanLoss>
               (FullyConnectedLayer *prevLayer,EuclideanLoss *nextLayer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar4;
  invalid_argument *this;
  GetShared<notch::core::FullyConnectedLayer> *access;
  GetShared<notch::core::EuclideanLoss> *access_1;
  string local_1e8 [32];
  string local_1c8 [32];
  ostringstream ss;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0 [46];
  
  iVar1 = (*(prevLayer->super_ABackpropLayer)._vptr_ABackpropLayer[1])();
  iVar2 = (*(prevLayer->super_ABackpropLayer)._vptr_ABackpropLayer[2])(prevLayer);
  iVar3 = (*(nextLayer->super_ALossLayer)._vptr_ALossLayer[4])(nextLayer);
  (*(nextLayer->super_ALossLayer)._vptr_ALossLayer[5])(nextLayer);
  if (CONCAT44(extraout_var_00,iVar2) == CONCAT44(extraout_var_01,iVar3)) {
    SharedBuffers::allocate
              (&(prevLayer->super_ABackpropLayer).shared,CONCAT44(extraout_var,iVar1),
               CONCAT44(extraout_var_00,iVar2));
    (*(prevLayer->super_ABackpropLayer)._vptr_ABackpropLayer[5])
              ((__shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2> *)&ss,prevLayer);
    std::__shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2> *)
               &(nextLayer->super_ALossLayer).shared,
               (__shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2> *)&ss);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1a0);
    return;
  }
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar4 = ::std::operator<<((ostream *)&ss,"can\'t connect ");
  (**(prevLayer->super_ABackpropLayer)._vptr_ABackpropLayer)(local_1e8,prevLayer);
  poVar4 = ::std::operator<<(poVar4,local_1e8);
  poVar4 = ::std::operator<<(poVar4," ");
  poVar4 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = ::std::operator<<(poVar4," in/");
  poVar4 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = ::std::operator<<(poVar4," out");
  poVar4 = ::std::operator<<(poVar4," to ");
  (**(nextLayer->super_ALossLayer)._vptr_ALossLayer)(local_1c8,nextLayer);
  poVar4 = ::std::operator<<(poVar4,local_1c8);
  poVar4 = ::std::operator<<(poVar4," ");
  poVar4 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = ::std::operator<<(poVar4," in/");
  poVar4 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  ::std::operator<<(poVar4," out");
  ::std::__cxx11::string::~string(local_1c8);
  ::std::__cxx11::string::~string(local_1e8);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::stringbuf::str();
  ::std::invalid_argument::invalid_argument(this,local_1e8);
  __cxa_throw(this,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument);
}

Assistant:

void connect(PREV_LAYER &prevLayer, NEXT_LAYER &nextLayer) {
    size_t prevIn = prevLayer.inputDim();
    size_t prevOut = prevLayer.outputDim();
    size_t nextIn = nextLayer.inputDim();
    size_t nextOut = nextLayer.outputDim();
    if (prevOut != nextIn) {
        std::ostringstream ss;
        ss << "can't connect " << prevLayer.tag() << " "
           << prevIn << " in/" << prevOut << " out"
           << " to " << nextLayer.tag() << " "
           << nextIn << " in/" << nextOut << " out";
        throw std::invalid_argument(ss.str());
    }
    GetShared<PREV_LAYER>::ref(prevLayer).allocate(prevIn, prevOut);
    GetShared<NEXT_LAYER>::ref(nextLayer).inputBuffer = prevLayer.getOutputBuffer();
}